

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckGlErrors.h
# Opt level: O3

bool GlLogCall(char *functionCall,char *file,int lineNo)

{
  int iVar1;
  ostream *this;
  size_t sVar2;
  long *plVar3;
  undefined4 in_register_00000014;
  
  iVar1 = glGetError(functionCall,file,CONCAT44(in_register_00000014,lineNo));
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[OpenGL Error] (",0x10);
    *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                  *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    this = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
         *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(this,") ",2);
    if (functionCall == (char *)0x0) {
      std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
    }
    else {
      sVar2 = strlen(functionCall);
      std::__ostream_insert<char,std::char_traits<char>>(this,functionCall,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>(this,": ",2);
    plVar3 = (long *)std::ostream::operator<<((ostream *)this,(int)file);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  return iVar1 == 0;
}

Assistant:

static bool GlLogCall(const char *functionCall, const char *file, int lineNo)
{
    GLenum error = glGetError();
    if (error == GL_NO_ERROR)
        return true;

    std::cout << "[OpenGL Error] ("
              << std::hex
              << error
              << std::dec << ") "
              << functionCall << " "
              << file << ": " << lineNo << std::endl;
    return false;
}